

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * __thiscall kj::Path::append(Path *__return_storage_ptr__,Path *this,PathPtr suffix)

{
  String *pSVar1;
  size_t sVar2;
  char *pcVar3;
  String *p;
  String *pSVar4;
  String *pSVar5;
  size_t sVar6;
  char *size;
  char *value;
  Array<kj::String> *__range1;
  long lVar7;
  ArrayBuilder<kj::String> newParts;
  String *pSStack_60;
  String local_48;
  
  sVar6 = suffix.parts.size_;
  pSVar4 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,(this->parts).size_ + sVar6,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar2 = (this->parts).size_;
  pSStack_60 = pSVar4;
  if (sVar2 != 0) {
    pSVar5 = (this->parts).ptr;
    pSVar1 = pSVar5 + sVar2;
    do {
      (pSStack_60->content).ptr = (pSVar5->content).ptr;
      (pSStack_60->content).size_ = (pSVar5->content).size_;
      (pSStack_60->content).disposer = (pSVar5->content).disposer;
      (pSVar5->content).ptr = (char *)0x0;
      (pSVar5->content).size_ = 0;
      pSStack_60 = pSStack_60 + 1;
      pSVar5 = pSVar5 + 1;
    } while (pSVar5 != pSVar1);
  }
  if (sVar6 != 0) {
    lVar7 = 0;
    do {
      pcVar3 = *(char **)((long)&((suffix.parts.ptr)->content).size_ + lVar7);
      value = pcVar3;
      if (pcVar3 != (char *)0x0) {
        value = *(char **)((long)&((suffix.parts.ptr)->content).ptr + lVar7);
      }
      size = (char *)0x0;
      if (pcVar3 != (char *)0x0) {
        size = pcVar3 + -1;
      }
      heapString(&local_48,value,(size_t)size);
      (pSStack_60->content).ptr = local_48.content.ptr;
      (pSStack_60->content).size_ = local_48.content.size_;
      (pSStack_60->content).disposer = local_48.content.disposer;
      pSStack_60 = pSStack_60 + 1;
      lVar7 = lVar7 + 0x18;
    } while (sVar6 * 0x18 != lVar7);
  }
  (__return_storage_ptr__->parts).ptr = pSVar4;
  (__return_storage_ptr__->parts).size_ =
       ((long)pSStack_60 - (long)pSVar4 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Path Path::append(PathPtr suffix) && {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(kj::mv(p));
  for (auto& p: suffix.parts) newParts.add(heapString(p));
  return Path(newParts.finish(), ALREADY_CHECKED);
}